

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O1

int Bac_ManFindRealNameId(Bac_Ntk_t *p,int iObj)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = Bac_ObjName(p,iObj);
  if ((iObj < 0) || ((p->vType).nSize <= iObj)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
  uVar3 = (uint)(byte)(p->vType).pArray[(uint)iObj];
  if ((9 < uVar3) || ((0x30cU >> (uVar3 & 0x1f) & 1) == 0)) {
    __assert_fail("Bac_ObjIsCi(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bacWriteVer.c"
                  ,0xf4,"int Bac_ManFindRealNameId(Bac_Ntk_t *, int)");
  }
  if (uVar2 != 0) {
    if (-1 < (int)uVar2) {
      if ((~uVar2 & 3) == 0) {
        uVar2 = Bac_ObjName(p,iObj - (uVar2 >> 2));
      }
      if (uVar2 == 0) goto LAB_0032693e;
      if (-1 < (int)uVar2) {
        if (1 < (uVar2 & 3)) {
          if ((uVar2 & 3) != 2) {
            __assert_fail("Bac_NameType(NameId) == BAC_NAME_BIN || Bac_NameType(NameId) == BAC_NAME_WORD"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bacWriteVer.c"
                          ,0xf9,"int Bac_ManFindRealNameId(Bac_Ntk_t *, int)");
          }
          uVar1 = (uVar2 >> 2) * 3;
          uVar3 = (p->vInfo).nSize;
          if (uVar3 == uVar1 || SBORROW4(uVar3,uVar1) != (int)(uVar3 + (uVar2 >> 2) * -3) < 0) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar2 = (p->vInfo).pArray[uVar1];
          if ((int)uVar2 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                          ,0x11a,"int Abc_Lit2Var2(int)");
          }
        }
        return uVar2 >> 2;
      }
    }
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                  ,0x11b,"int Abc_Lit2Att2(int)");
  }
LAB_0032693e:
  __assert_fail("n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bac.h"
                ,0x107,"Bac_NameType_t Bac_NameType(int)");
}

Assistant:

static inline int Bac_ManFindRealNameId( Bac_Ntk_t * p, int iObj )
{
    int NameId = Bac_ObjName(p, iObj);
    assert( Bac_ObjIsCi(p, iObj) );
    if ( Bac_NameType(NameId) == BAC_NAME_INDEX )
        NameId = Bac_ObjName(p, iObj - Abc_Lit2Var2(NameId));
    if ( Bac_NameType(NameId) == BAC_NAME_INFO )
        return Bac_NtkInfoName(p, Abc_Lit2Var2(NameId));
    assert( Bac_NameType(NameId) == BAC_NAME_BIN || Bac_NameType(NameId) == BAC_NAME_WORD );
    return Abc_Lit2Var2(NameId);
}